

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O3

void __thiscall C_matrix<double>::save(C_matrix<double> *this,string *fileName)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  ofstream myfileX;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    if (0 < this->m_L) {
      uVar7 = 0;
      uVar6 = 0;
      do {
        iVar2 = this->m_C;
        if (0 < iVar2) {
          uVar4 = 0;
          uVar8 = 1;
          do {
            poVar3 = std::ostream::_M_insert<double>(this->m_A[(int)(iVar2 * uVar7 + uVar4)]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
            uVar4 = (uint)uVar8;
            iVar2 = this->m_C;
            uVar5 = (uint)uVar8;
            uVar8 = uVar8 + 1;
          } while ((int)uVar5 < iVar2);
        }
        cVar1 = (char)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        uVar6 = uVar6 + 1;
        uVar7 = uVar6 & 0xffff;
      } while ((int)uVar7 < this->m_L);
    }
    std::ofstream::close();
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void C_matrix<dataType>::save(std::string fileName)
{
    std::ofstream myfileX;
    myfileX.open (fileName.data(), std::ios::out );

    if(myfileX.is_open())
    {
        for(unsigned short i=0 ; i<m_L ; i++)
        {
            for(unsigned short j=0 ; j<m_C ; j++)
            {
                myfileX << m_A[getIndex(i,j)] << "\t";
            }
            myfileX << std::endl;
        }
        myfileX.close();
    }
}